

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O2

WeightConstraint *
Clasp::WeightConstraint::doCreate(Solver *s,Literal W,WeightLitsRep *rep,uint32 flags)

{
  uint32 uVar1;
  Share SVar2;
  Solver *s_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  uint uVar7;
  SharedContext *ctx;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  WL *out;
  uint32 act;
  size_type i;
  uint uVar12;
  Result RVar13;
  WeightConstraint *pWStackY_90;
  Literal bin [2];
  LitVec clause;
  ClauseRep local_48;
  Solver *local_38;
  
  act = 3;
  if (((flags & 0xc0) != 0) && ((flags & 0xc0) != 0xc0)) {
    act = flags >> 7 & 1;
  }
  uVar1 = rep->size;
  Solver::acquireProblemVar(s,W.rep_ >> 2);
  bVar4 = WeightLitsRep::propagate(rep,s,W);
  pWStackY_90 = (WeightConstraint *)0x1;
  if (bVar4) {
    iVar8 = rep->bound;
    pWStackY_90 = (WeightConstraint *)0x0;
    if ((iVar8 <= rep->reach) && (0 < iVar8 || ((byte)flags >> 2 & uVar1 != 0) != 0)) {
      if ((iVar8 == 1 || iVar8 == rep->reach) && (act == 3 && (flags & 1) == 0)) {
        clause.ebo_.buf = (pointer)0x0;
        clause.ebo_.size = 0;
        clause.ebo_.cap = 0;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::reserve
                  (&clause,rep->size + 1);
        bin[0].rep_ = 0;
        bin[1].rep_ = 0;
        uVar11 = (uint)(rep->bound == 1) * 2;
        local_48.info.super_ConstraintScore.rep =
             (ConstraintScore)(ConstraintScore)(W.rep_ & 0xfffffffe ^ uVar11);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (&clause,(Literal *)&local_48);
        pWStackY_90 = (WeightConstraint *)0x1;
        bVar4 = false;
        for (uVar12 = 0; uVar12 != rep->size; uVar12 = uVar12 + 1) {
          uVar10 = (clause.ebo_.buf)->rep_;
          uVar7 = rep->lits[uVar12].first.rep_ & 0xfffffffe ^ uVar11;
          bin = (Literal  [2])(CONCAT44(uVar7,uVar10) & 0xfffffffffffffffe ^ 2);
          bVar3 = true;
          if (1 < (uVar10 ^ uVar7)) {
            if (uVar7 != (uVar10 & 0xfffffffe ^ 2)) {
              local_48._0_8_ = CONCAT44(local_48._4_4_,uVar7) ^ 2;
              bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                        (&clause,(Literal *)&local_48);
            }
            local_48._0_8_ = 0x200000000;
            local_48.lits = bin;
            bVar5 = Solver::add(s,&local_48,true);
            bVar3 = bVar4;
            if (!bVar5) goto LAB_001726cf;
          }
          bVar4 = bVar3;
        }
        if (bVar4) {
          pWStackY_90 = (WeightConstraint *)0x0;
        }
        else {
          local_48._0_8_ = (ulong)(uint)local_48._4_4_ << 0x20;
          RVar13 = ClauseCreator::create(s,&clause,0,&local_48.info);
          pWStackY_90 = (WeightConstraint *)(ulong)((RVar13.status & status_unsat) >> 1);
        }
LAB_001726cf:
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(&clause.ebo_)
        ;
      }
      else {
        SVar2 = s->shared_->share_;
        uVar11 = 0x18;
        if (((uint)SVar2 >> 0x19 & 1) == 0) {
          uVar11 = ~(uint)SVar2 >> 0x10 & 0x10;
        }
        uVar1 = rep->size;
        if (uVar1 == 0) {
          bVar4 = false;
        }
        else {
          bVar4 = 1 < rep->lits->second;
        }
        uVar7 = (uint)bVar4;
        uVar10 = uVar1 + 1;
        iVar8 = (uVar1 + uVar7 + 1) * 4;
        uVar12 = (uVar10 << bVar4) * 4 + 4;
        local_38 = s;
        if (((uVar11 | flags) & 0x10) == 0) {
          pWStackY_90 = (WeightConstraint *)operator_new((ulong)(iVar8 + 0x20));
          puVar6 = (undefined4 *)operator_new((ulong)uVar12 + 4);
          LOCK();
          *puVar6 = 1;
          UNLOCK();
          puVar6[1] = (uVar10 & 0x3fffffff) + 0x40000000 + uVar7 * -0x80000000;
          out = (WL *)(puVar6 + 1);
        }
        else {
          uVar9 = iVar8 + 0x20;
          pWStackY_90 = (WeightConstraint *)operator_new((ulong)(uVar9 + uVar12));
          out = (WL *)((long)pWStackY_90->bound_ + ((ulong)uVar9 - 0x14));
          *(uint *)((long)pWStackY_90->bound_ + ((ulong)uVar9 - 0x14)) =
               uVar7 << 0x1f | uVar10 & 0x3fffffff;
        }
        s_00 = local_38;
        if (((uVar11 | flags) & 8) == 0) {
          ctx = local_38->shared_;
        }
        else {
          ctx = (SharedContext *)0x0;
        }
        WeightConstraint(pWStackY_90,local_38,ctx,W,rep,out,act);
        bVar4 = integrateRoot(pWStackY_90,s_00);
        if (bVar4) {
          if ((flags & 3) == 0) {
            Solver::add(s_00,&pWStackY_90->super_Constraint);
          }
        }
        else {
          (*(pWStackY_90->super_Constraint)._vptr_Constraint[5])(pWStackY_90,s_00,1);
          pWStackY_90 = (WeightConstraint *)0x1;
        }
      }
    }
  }
  return pWStackY_90;
}

Assistant:

WeightConstraint* WeightConstraint::doCreate(Solver& s, Literal W, WeightLitsRep& rep, uint32 flags) {
	WeightConstraint* conflict = (WeightConstraint*)0x1;
	const uint32 onlyOne = create_only_btb|create_only_bfb;
	uint32 act  = 3u;
	if ((flags & onlyOne) && (flags & onlyOne) != onlyOne) {
		act = (flags & create_only_bfb) != 0u;
	}
	bool addSat = (flags&create_sat) != 0 && rep.size;
	s.acquireProblemVar(W.var());
	if (!rep.propagate(s, W))                 { return conflict; }
	if (rep.unsat() || (rep.sat() && !addSat)){ return 0; }
	if ((rep.bound == 1 || rep.bound == rep.reach) && (flags & create_explicit) == 0 && act == 3u) {
		LitVec clause; clause.reserve(1 + rep.size);
		Literal bin[2];
		bool disj = rep.bound == 1; // con == disjunction or con == conjunction
		bool sat  = false;
		clause.push_back(W ^ disj);
		for (LitVec::size_type i = 0; i != rep.size; ++i) {
			bin[0] = ~clause[0];
			bin[1] = rep.lits[i].first ^ disj;
			if (bin[0] != ~bin[1]) {
				if (bin[0] != bin[1])                 { clause.push_back(~bin[1]); }
				if (!s.add(ClauseRep::create(bin, 2))){ return conflict; }
			}
			else { sat = true; }
		}
		return (sat || ClauseCreator::create(s, clause, 0)) ? 0 : conflict;
	}
	assert(rep.open() || (rep.sat() && addSat));
	if (!s.sharedContext()->physicalShareProblem()) { flags |= create_no_share; }
	if (s.sharedContext()->frozen())                { flags |= (create_no_freeze|create_no_share); }
	bool   hasW = rep.hasWeights();
	uint32 size = 1 + rep.size;
	uint32 nb   = sizeof(WeightConstraint) + (size+uint32(hasW))*sizeof(UndoInfo);
	uint32 wls  = sizeof(WL) + (size << uint32(hasW))*sizeof(Literal);
	void*  m    = 0;
	WL*    sL   = 0;
	if ((flags & create_no_share) != 0) {
		nb = ((nb + 3) / 4)*4;
		m  = ::operator new (nb + wls);
		sL = new (reinterpret_cast<unsigned char*>(m)+nb) WL(size, false, hasW);
	}
	else {
		static_assert(sizeof(RCType) == sizeof(uint32), "Invalid size!");
		m = ::operator new(nb);
		uint8* t = (uint8*)::operator new(wls + sizeof(uint32));
		*(new (t) RCType) = 1;
		sL = new (t+sizeof(uint32)) WL(size, true, hasW);
	}
	assert(m && (reinterpret_cast<uintp>(m) & 7u) == 0);
	SharedContext*  ctx = (flags & create_no_freeze) == 0 ? const_cast<SharedContext*>(s.sharedContext()) : 0;
	WeightConstraint* c = new (m) WeightConstraint(s, ctx, W, rep, sL, act);
	if (!c->integrateRoot(s)) {
		c->destroy(&s, true);
		return conflict;
	}
	if ((flags & create_no_add) == 0) { s.add(c); }
	return c;
}